

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O1

CURLcode set_trace_config(GlobalConfig *global,char *token)

{
  ushort uVar1;
  int iVar2;
  CURLcode CVar3;
  CURLcode CVar4;
  char *pcVar5;
  ushort uVar6;
  char *pcVar7;
  size_t sVar8;
  bool bVar9;
  char buffer [32];
  undefined1 local_58 [40];
  
  CVar4 = CURLE_OK;
  do {
    if (token == (char *)0x0) {
      return CVar4;
    }
    pcVar5 = strchr(token,0x2c);
    if (pcVar5 == (char *)0x0) {
      sVar8 = strlen(token);
    }
    else {
      sVar8 = (long)pcVar5 - (long)token;
    }
    bVar9 = true;
    if (*token == '+') {
      sVar8 = sVar8 - 1;
      pcVar7 = token + 1;
    }
    else {
      pcVar7 = token;
      if (*token == '-') {
        sVar8 = sVar8 - 1;
        bVar9 = false;
        pcVar7 = token + 1;
      }
    }
    if (sVar8 == 4) {
      iVar2 = curl_strnequal(pcVar7,"time",4);
      if (iVar2 == 0) goto LAB_001125e7;
      uVar1 = 0xffdf;
      uVar6 = 0x20;
LAB_001125cc:
      if (bVar9 == false) {
        uVar6 = 0;
      }
      *(ushort *)&global->field_0x63 = uVar1 & *(ushort *)&global->field_0x63 | uVar6;
LAB_00112627:
      bVar9 = true;
      if (pcVar5 == (char *)0x0) {
        token = (char *)0x0;
      }
      else {
        token = pcVar5 + 2;
        if (pcVar5[1] != ' ') {
          token = pcVar5 + 1;
        }
      }
    }
    else if (sVar8 == 3) {
      iVar2 = curl_strnequal(pcVar7,"all",3);
      if (iVar2 == 0) {
        iVar2 = curl_strnequal(pcVar7,"ids",3);
        if (iVar2 != 0) {
          uVar1 = 0xffbf;
          uVar6 = 0x40;
          goto LAB_001125cc;
        }
        goto LAB_001125e7;
      }
      CVar4 = CURLE_OK;
      uVar1 = 0;
      if (bVar9) {
        uVar1 = 0x60;
      }
      *(ushort *)&global->field_0x63 = uVar1 | *(ushort *)&global->field_0x63 & 0xff9f;
      CVar3 = curl_global_trace(token);
      if (CVar3 == CURLE_OK) goto LAB_00112627;
      bVar9 = false;
      CVar4 = CVar3;
    }
    else {
LAB_001125e7:
      curl_msnprintf(local_58,0x20,"%c%.*s",(bVar9 ^ 1U) * '\x02' + '+',sVar8 & 0xffffffff,pcVar7);
      CVar4 = curl_global_trace(local_58);
      bVar9 = CVar4 == CURLE_OK;
      if (bVar9) goto LAB_00112627;
    }
    if (!bVar9) {
      return CVar4;
    }
  } while( true );
}

Assistant:

static CURLcode set_trace_config(struct GlobalConfig *global,
                                 const char *token)
{
  CURLcode result = CURLE_OK;
  const char *next, *name;
  bool toggle;

  while(token) {
    size_t len;
    next = strchr(token, ',');

    if(next)
      len = next - token;
    else
      len = strlen(token);

    switch(*token) {
      case '-':
        toggle = FALSE;
        name = token + 1;
        len--;
        break;
      case '+':
        toggle = TRUE;
        name = token + 1;
        len--;
        break;
      default:
        toggle = TRUE;
        name = token;
        break;
    }

    if((len == 3) && strncasecompare(name, "all", 3)) {
      global->traceids = toggle;
      global->tracetime = toggle;
      result = curl_global_trace(token);
      if(result)
        goto out;
    }
    else if((len == 3) && strncasecompare(name, "ids", 3)) {
      global->traceids = toggle;
    }
    else if((len == 4) && strncasecompare(name, "time", 4)) {
      global->tracetime = toggle;
    }
    else {
      char buffer[32];
      msnprintf(buffer, sizeof(buffer), "%c%.*s", toggle ? '+' : '-',
                (int)len, name);
      result = curl_global_trace(buffer);
      if(result)
        goto out;
    }
    if(next) {
      next++;
      if(*next == ' ')
        next++;
    }
    token = next;
  }
out:
  return result;
}